

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkLibrariesCommand.cxx
# Opt level: O1

bool cmTargetLinkLibrariesCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pcVar1;
  pointer puVar2;
  pointer puVar3;
  pointer pcVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  TargetType TVar8;
  PolicyStatus PVar9;
  cmake *pcVar10;
  string *psVar11;
  ostream *poVar12;
  size_t sVar13;
  cmMakefile *pcVar14;
  const_iterator cVar15;
  ulong uVar16;
  cmValue cVar17;
  PolicyID id;
  PolicyID id_00;
  PolicyID id_01;
  MessageType t;
  pointer puVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__u;
  long *plVar19;
  ProcessingState currentProcessingState;
  pointer pbVar20;
  char *pcVar21;
  undefined7 uVar22;
  cmTargetLinkLibraryType llt;
  cmTargetLinkLibraryType cVar23;
  long lVar24;
  ulong uVar25;
  cmMakefile *this;
  bool bVar26;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  currentEntry;
  TLL tll;
  cmDirectoryId dirId;
  ostringstream e;
  long local_2d0;
  ulong local_2c0;
  cmTarget *local_2b8;
  undefined1 local_2a9;
  string local_2a8;
  char local_288;
  cmTargetLinkLibraryType local_27c;
  uint local_278;
  ProcessingState local_274;
  cmMakefile *local_270;
  undefined1 local_268 [24];
  string local_250 [8];
  size_type local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  __node_base_ptr *local_230;
  size_type local_228;
  __node_base local_220;
  size_type sStack_218;
  float local_210;
  size_t local_208;
  __node_base_ptr p_Stack_200;
  undefined1 local_1f8 [48];
  string local_1c8;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  undefined1 *local_188;
  pointer local_180;
  undefined1 local_178 [16];
  undefined1 *local_168 [2];
  undefined1 local_158 [16];
  ios_base *local_148 [2];
  ios_base local_138 [16];
  undefined1 *local_128 [2];
  undefined1 local_118 [16];
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  long *local_a8 [2];
  long local_98 [2];
  undefined1 local_88 [88];
  
  psVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (psVar11 ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_1a8._0_8_ = &local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_0035b76d:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._0_8_ != &local_198) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_198._M_allocated_capacity + 1));
    }
    return false;
  }
  this = status->Makefile;
  bVar5 = cmMakefile::IsAlias(this,psVar11);
  if (bVar5) {
    local_1a8._0_8_ = &local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"can not be used on an ALIAS target.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    goto LAB_0035b76d;
  }
  pcVar10 = cmMakefile::GetCMakeInstance(this);
  local_2b8 = cmGlobalGenerator::FindTarget
                        ((pcVar10->GlobalGenerator)._M_t.
                         super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                         .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,
                         (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start,false);
  if (local_2b8 == (cmTarget *)0x0) {
    puVar2 = (this->ImportedTargetsOwned).
             super__Vector_base<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar3 = (this->ImportedTargetsOwned).
             super__Vector_base<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar2 == puVar3) {
      local_2b8 = (cmTarget *)0x0;
    }
    else {
      local_2b8 = (cmTarget *)0x0;
      do {
        puVar18 = puVar2 + 1;
        psVar11 = cmTarget::GetName_abi_cxx11_
                            ((puVar2->_M_t).
                             super___uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_>._M_t.
                             super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>.
                             super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl);
        pbVar20 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        sVar13 = psVar11->_M_string_length;
        if (sVar13 == pbVar20->_M_string_length) {
          if (sVar13 == 0) {
            bVar5 = true;
          }
          else {
            iVar7 = bcmp((psVar11->_M_dataplus)._M_p,(pbVar20->_M_dataplus)._M_p,sVar13);
            bVar5 = iVar7 == 0;
          }
        }
        else {
          bVar5 = false;
        }
        if (bVar5) {
          local_2b8 = (puVar2->_M_t).super___uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_>
                      ._M_t.super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>.
                      super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl;
        }
        puVar2 = puVar18;
      } while (!(bool)(bVar5 | puVar18 == puVar3));
    }
  }
  if (local_2b8 == (cmTarget *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Cannot specify link libraries for target \"",0x2a);
    pbVar20 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(pbVar20->_M_dataplus)._M_p,pbVar20->_M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\" ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,"which is not built by this project.",0x23);
    iVar7 = 2;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
               (long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start) < 0x21) {
      PVar9 = cmMakefile::GetPolicyStatus(this,CMP0016,false);
      if (PVar9 - REQUIRED_IF_USED < 2) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
        cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)local_268,(cmPolicies *)0x10,id_01);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(char *)local_268._0_8_,local_268._8_8_);
        if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
          operator_delete((void *)local_268._0_8_,
                          CONCAT53(local_268._19_5_,
                                   CONCAT12(local_268[0x12],
                                            CONCAT11(local_268[0x11],local_268[0x10]))) + 1);
        }
      }
      else if (PVar9 == OLD) {
        iVar7 = 4;
      }
      else if (PVar9 == WARN) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "CMake does not support this but it used to work accidentally ",0x3d);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"and is being allowed for compatibility.",0x27);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
        cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_268,(cmPolicies *)0x10,id_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(char *)local_268._0_8_,local_268._8_8_);
        if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
          operator_delete((void *)local_268._0_8_,
                          CONCAT53(local_268._19_5_,
                                   CONCAT12(local_268[0x12],
                                            CONCAT11(local_268[0x11],local_268[0x10]))) + 1);
        }
        iVar7 = 0;
      }
    }
    if (iVar7 == 2) {
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(this,FATAL_ERROR,(string *)local_268);
      if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
        operator_delete((void *)local_268._0_8_,
                        CONCAT53(local_268._19_5_,
                                 CONCAT12(local_268[0x12],CONCAT11(local_268[0x11],local_268[0x10]))
                                ) + 1);
      }
      cmSystemTools::s_FatalErrorOccurred = true;
    }
    else if (iVar7 == 0) {
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(this,AUTHOR_WARNING,(string *)local_268);
      if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
        operator_delete((void *)local_268._0_8_,
                        CONCAT53(local_268._19_5_,
                                 CONCAT12(local_268[0x12],CONCAT11(local_268[0x11],local_268[0x10]))
                                ) + 1);
      }
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    return true;
  }
  TVar8 = cmTarget::GetType(local_2b8);
  if (TVar8 == UTILITY) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    t = AUTHOR_WARNING;
    PVar9 = cmMakefile::GetPolicyStatus(this,CMP0039,false);
    if (PVar9 - NEW < 3) {
      pcVar21 = "must";
      t = FATAL_ERROR;
      bVar5 = true;
LAB_0035ba87:
      bVar26 = false;
    }
    else {
      if (PVar9 == WARN) {
        cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_268,(cmPolicies *)&DAT_00000027,id);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(char *)local_268._0_8_,local_268._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
        if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
          operator_delete((void *)local_268._0_8_,
                          CONCAT53(local_268._19_5_,
                                   CONCAT12(local_268[0x12],
                                            CONCAT11(local_268[0x11],local_268[0x10]))) + 1);
        }
        pcVar21 = "should";
        bVar5 = false;
        t = AUTHOR_WARNING;
        goto LAB_0035ba87;
      }
      bVar26 = true;
      bVar5 = false;
      pcVar21 = (char *)0x0;
    }
    if (!bVar26) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Utility target \"",0x10);
      psVar11 = cmTarget::GetName_abi_cxx11_(local_2b8);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,(psVar11->_M_dataplus)._M_p,
                           psVar11->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\" ",2);
      sVar13 = strlen(pcVar21);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar21,sVar13);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12," not be used as the target of a target_link_libraries call.",0x3b);
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(this,t,(string *)local_268);
      if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
        operator_delete((void *)local_268._0_8_,
                        CONCAT53(local_268._19_5_,
                                 CONCAT12(local_268[0x12],CONCAT11(local_268[0x11],local_268[0x10]))
                                ) + 1);
      }
      if (bVar5) {
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        return false;
      }
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x21) {
    return true;
  }
  local_250 = (string  [8])&local_240;
  local_268._8_8_ = local_2b8;
  local_268[0x10] = '\0';
  local_268[0x11] = '\0';
  local_268[0x12] = '\0';
  local_248 = 0;
  local_240._M_local_buf[0] = '\0';
  local_230 = &p_Stack_200;
  local_228 = 1;
  local_220._M_nxt = (_Hash_node_base *)0x0;
  sStack_218 = 0;
  local_210 = 1.0;
  local_208 = 0;
  p_Stack_200 = (__node_base_ptr)0x0;
  local_268._0_8_ = this;
  pcVar14 = cmTarget::GetMakefile(local_2b8);
  if (pcVar14 != this) {
    PVar9 = cmMakefile::GetPolicyStatus((cmMakefile *)local_268._0_8_,CMP0079,false);
    if (PVar9 - NEW < 3) {
      local_268[0x12] = '\x01';
    }
    else {
      if (PVar9 != OLD) {
        if (PVar9 != WARN) goto LAB_0035bcfc;
        local_268[0x10] = '\x01';
      }
      local_268[0x11] = '\x01';
    }
  }
LAB_0035bcfc:
  if (local_268[0x12] == '\x01') {
    cmMakefile::GetDirectoryId((cmDirectoryId *)local_1f8,(cmMakefile *)local_268._0_8_);
    local_1a8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x3;
    local_1a8._8_8_ = "::@";
    local_198._M_allocated_capacity = local_1f8._8_8_;
    local_198._8_8_ = local_1f8._0_8_;
    views._M_len = 2;
    views._M_array = (iterator)local_1a8;
    cmCatViews_abi_cxx11_(&local_2a8,views);
    std::__cxx11::string::operator=(local_250,(string *)&local_2a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
      operator_delete((void *)local_1f8._0_8_,CONCAT71(local_1f8._17_7_,local_1f8[0x10]) + 1);
    }
  }
  local_288 = '\0';
  local_270 = this;
  if ((cmTargetLinkLibrariesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::keywords_abi_cxx11_ == '\0') &&
     (iVar7 = __cxa_guard_acquire(&cmTargetLinkLibrariesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::keywords_abi_cxx11_), iVar7 != 0)) {
    local_1a8._0_8_ = &local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"LINK_INTERFACE_LIBRARIES","");
    local_188 = local_178;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"INTERFACE","");
    local_168[0] = local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"LINK_PUBLIC","");
    local_148[0] = local_138;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"PUBLIC","");
    local_128[0] = local_118;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"LINK_PRIVATE","");
    local_108[0] = local_f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"PRIVATE","");
    local_e8[0] = local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"debug","");
    local_c8[0] = local_b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"optimized","");
    plVar19 = local_98;
    local_a8[0] = plVar19;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"general","");
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::_Hashtable<std::__cxx11::string_const*>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&cmTargetLinkLibrariesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::keywords_abi_cxx11_,local_1a8,local_88,0,local_1f8,&local_1c8,&local_2a9);
    lVar24 = -0x120;
    do {
      if (plVar19 != (long *)plVar19[-2]) {
        operator_delete((long *)plVar19[-2],*plVar19 + 1);
      }
      plVar19 = plVar19 + -4;
      lVar24 = lVar24 + 0x20;
    } while (lVar24 != 0);
    __cxa_atexit(std::
                 unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::~unordered_set,
                 &cmTargetLinkLibrariesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                  ::keywords_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&cmTargetLinkLibrariesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::keywords_abi_cxx11_);
    this = local_270;
  }
  pbVar20 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  llt = GENERAL_LibraryType;
  bVar26 = (ulong)((long)(args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar20) < 0x21;
  bVar5 = !bVar26;
  if (bVar26) {
    uVar25 = 0;
    currentProcessingState = ProcessingLinkLibraries;
    bVar26 = false;
  }
  else {
    llt = GENERAL_LibraryType;
    local_2c0 = 1;
    currentProcessingState = ProcessingLinkLibraries;
    uVar25 = 0;
    local_2d0 = 0;
    do {
      cVar15 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::find(&cmTargetLinkLibrariesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                       ::keywords_abi_cxx11_._M_h,pbVar20 + local_2c0);
      if (cVar15.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        if ((uVar25 & 1) == 0) {
          pbVar20 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          uVar16 = pbVar20[local_2c0]._M_string_length;
          local_27c = llt;
          local_278 = (uint)uVar25;
          local_274 = currentProcessingState;
          if (uVar16 != 0) {
            pcVar4 = pbVar20[local_2c0]._M_dataplus._M_p;
            uVar25 = 0;
            do {
              pcVar1 = pcVar4 + uVar25;
              __str._M_str = "$<";
              __str._M_len = 2;
              local_1a8._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(uVar16 - uVar25);
              local_1a8._8_8_ = pcVar1;
              iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                ((basic_string_view<char,_std::char_traits<char>_> *)local_1a8,0,2,
                                 __str);
              if (iVar7 == 0) {
                local_2d0 = local_2d0 + 1;
                uVar25 = uVar25 + 1;
              }
              else if (local_2d0 != 0) {
                __str_00._M_str = ">";
                __str_00._M_len = 1;
                local_1a8._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(uVar16 - uVar25);
                local_1a8._8_8_ = pcVar1;
                iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                  ((basic_string_view<char,_std::char_traits<char>_> *)local_1a8,0,1
                                   ,__str_00);
                local_2d0 = local_2d0 - (ulong)(iVar7 == 0);
              }
              uVar25 = uVar25 + 1;
            } while (uVar25 < uVar16);
          }
          __u = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + local_2c0;
          if (local_288 == '\x01') {
            local_1f8._0_8_ = &DAT_00000001;
            local_1f8._8_8_ = local_1f8 + 0x10;
            local_1f8[0x10] = ';';
            local_1a8._0_8_ = local_2a8._M_string_length;
            local_1a8._8_8_ = local_2a8._M_dataplus._M_p;
            local_198._M_allocated_capacity = (size_type)&DAT_00000001;
            local_180 = (__u->_M_dataplus)._M_p;
            local_188 = (undefined1 *)__u->_M_string_length;
            views_00._M_len = 3;
            views_00._M_array = (iterator)local_1a8;
            local_198._8_8_ = local_1f8._8_8_;
            cmCatViews_abi_cxx11_(&local_1c8,views_00);
            this = local_270;
            currentProcessingState = local_274;
            llt = local_27c;
            uVar25 = (ulong)local_278;
            std::optional<std::__cxx11::string>::operator=
                      ((optional<std::__cxx11::string> *)&local_2a8,&local_1c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
              operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1
                             );
            }
          }
          else {
            std::optional<std::__cxx11::string>::operator=
                      ((optional<std::__cxx11::string> *)&local_2a8,__u);
            uVar25 = (ulong)local_278;
            this = local_270;
            llt = local_27c;
            currentProcessingState = local_274;
          }
          cVar23 = llt;
          if (local_2d0 == 0) {
            if (local_288 == '\x01') {
              bVar26 = anon_unknown.dwarf_11e8913::TLL::HandleLibrary
                                 ((TLL *)local_268,currentProcessingState,&local_2a8,
                                  GENERAL_LibraryType);
              if (!bVar26) goto LAB_0035c466;
              if ((local_288 == '\x01') &&
                 (local_288 = '\0',
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_2a8._M_dataplus._M_p != &local_2a8.field_2)) {
                operator_delete(local_2a8._M_dataplus._M_p,
                                local_2a8.field_2._M_allocated_capacity + 1);
              }
            }
            goto LAB_0035bfe8;
          }
        }
        else {
          if (local_288 == '\x01') {
            __assert_fail("!currentEntry",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmTargetLinkLibrariesCommand.cxx"
                          ,0x142,
                          "bool cmTargetLinkLibrariesCommand(const std::vector<std::string> &, cmExecutionStatus &)"
                         );
          }
          bVar6 = anon_unknown.dwarf_11e8913::TLL::HandleLibrary
                            ((TLL *)local_268,currentProcessingState,
                             (args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + local_2c0,llt);
          uVar25 = 0;
          bVar26 = false;
          cVar23 = GENERAL_LibraryType;
          if (!bVar6) goto LAB_0035c62f;
        }
      }
      else {
        if (local_288 == '\x01') {
          if ((uVar25 & 1) != 0) goto LAB_0035c85c;
          bVar26 = anon_unknown.dwarf_11e8913::TLL::HandleLibrary
                             ((TLL *)local_268,currentProcessingState,&local_2a8,GENERAL_LibraryType
                             );
          if (!bVar26) {
LAB_0035c466:
            bVar26 = false;
            goto LAB_0035c62f;
          }
          if ((local_288 == '\x01') &&
             (local_288 = '\0',
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_2a8._M_dataplus._M_p != &local_2a8.field_2)) {
            operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
          }
        }
        iVar7 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + local_2c0));
        if (iVar7 == 0) {
          if ((int)local_2c0 != 1) {
            local_1a8._0_8_ = &local_198;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8,
                       "The LINK_INTERFACE_LIBRARIES option must appear as the second argument, just after the target name."
                       ,"");
            cmMakefile::IssueMessage(this,FATAL_ERROR,(string *)local_1a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._0_8_ != &local_198) {
              operator_delete((void *)local_1a8._0_8_,(ulong)(local_198._M_allocated_capacity + 1));
            }
            bVar26 = true;
            currentProcessingState = ProcessingPlainLinkInterface;
            goto LAB_0035c62f;
          }
          currentProcessingState = ProcessingPlainLinkInterface;
LAB_0035bfe8:
          local_2d0 = 0;
          cVar23 = llt;
        }
        else {
          iVar7 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + local_2c0));
          cVar23 = llt;
          if (iVar7 == 0) {
            if ((((int)local_2c0 != 1) && (currentProcessingState != ProcessingKeywordLinkInterface)
                ) && ((currentProcessingState & ~ProcessingKeywordLinkInterface) !=
                      ProcessingKeywordPublicInterface)) {
              local_1a8._0_8_ = &local_198;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1a8,
                         "The INTERFACE, PUBLIC or PRIVATE option must appear as the second argument, just after the target name."
                         ,"");
              cmMakefile::IssueMessage(this,FATAL_ERROR,(string *)local_1a8);
LAB_0035c60c:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8._0_8_ != &local_198) {
                operator_delete((void *)local_1a8._0_8_,(ulong)(local_198._M_allocated_capacity + 1)
                               );
              }
              bVar26 = true;
              goto LAB_0035c62f;
            }
            local_2d0 = 0;
            currentProcessingState = ProcessingKeywordLinkInterface;
          }
          else {
            iVar7 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + local_2c0));
            if (iVar7 == 0) {
              if ((((int)local_2c0 != 1) &&
                  (currentProcessingState != ProcessingPlainPrivateInterface)) &&
                 (currentProcessingState != ProcessingPlainPublicInterface)) {
                local_1a8._0_8_ = &local_198;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1a8,
                           "The LINK_PUBLIC or LINK_PRIVATE option must appear as the second argument, just after the target name."
                           ,"");
                cmMakefile::IssueMessage(this,FATAL_ERROR,(string *)local_1a8);
                goto LAB_0035c60c;
              }
              local_2d0 = 0;
              currentProcessingState = ProcessingPlainPublicInterface;
            }
            else {
              iVar7 = std::__cxx11::string::compare
                                ((char *)((args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + local_2c0));
              if (iVar7 == 0) {
                if ((((int)local_2c0 != 1) &&
                    (currentProcessingState != ProcessingKeywordLinkInterface)) &&
                   ((currentProcessingState & ~ProcessingKeywordLinkInterface) !=
                    ProcessingKeywordPublicInterface)) {
                  local_1a8._0_8_ = &local_198;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1a8,
                             "The INTERFACE, PUBLIC or PRIVATE option must appear as the second argument, just after the target name."
                             ,"");
                  cmMakefile::IssueMessage(this,FATAL_ERROR,(string *)local_1a8);
                  goto LAB_0035c60c;
                }
                local_2d0 = 0;
                currentProcessingState = ProcessingKeywordPublicInterface;
              }
              else {
                iVar7 = std::__cxx11::string::compare
                                  ((char *)((args->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + local_2c0))
                ;
                if (iVar7 == 0) {
                  if ((((int)local_2c0 != 1) &&
                      (currentProcessingState != ProcessingPlainPublicInterface)) &&
                     (currentProcessingState != ProcessingPlainPrivateInterface)) {
                    local_1a8._0_8_ = &local_198;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1a8,
                               "The LINK_PUBLIC or LINK_PRIVATE option must appear as the second argument, just after the target name."
                               ,"");
                    cmMakefile::IssueMessage(this,FATAL_ERROR,(string *)local_1a8);
                    goto LAB_0035c60c;
                  }
                  local_2d0 = 0;
                  currentProcessingState = ProcessingPlainPrivateInterface;
                }
                else {
                  iVar7 = std::__cxx11::string::compare
                                    ((char *)((args->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start + local_2c0
                                             ));
                  if (iVar7 == 0) {
                    if ((((int)local_2c0 != 1) &&
                        (currentProcessingState != ProcessingKeywordLinkInterface)) &&
                       ((currentProcessingState & ~ProcessingKeywordLinkInterface) !=
                        ProcessingKeywordPublicInterface)) {
                      local_1a8._0_8_ = &local_198;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_1a8,
                                 "The INTERFACE, PUBLIC or PRIVATE option must appear as the second argument, just after the target name."
                                 ,"");
                      cmMakefile::IssueMessage(this,FATAL_ERROR,(string *)local_1a8);
                      goto LAB_0035c60c;
                    }
                    local_2d0 = 0;
                    currentProcessingState = ProcessingKeywordPrivateInterface;
                  }
                  else {
                    iVar7 = std::__cxx11::string::compare
                                      ((char *)((args->
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start +
                                               local_2c0));
                    uVar22 = (undefined7)(uVar25 >> 8);
                    if (iVar7 == 0) {
                      cVar23 = DEBUG_LibraryType;
                      if ((uVar25 & 1) != 0) {
                        LinkLibraryTypeSpecifierWarning(this,llt,1);
                      }
                    }
                    else {
                      iVar7 = std::__cxx11::string::compare
                                        ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                 local_2c0));
                      if (iVar7 == 0) {
                        cVar23 = OPTIMIZED_LibraryType;
                        if ((uVar25 & 1) != 0) {
                          LinkLibraryTypeSpecifierWarning(this,llt,2);
                        }
                      }
                      else {
                        iVar7 = std::__cxx11::string::compare
                                          ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  local_2c0));
                        if (iVar7 != 0) goto LAB_0035bfe8;
                        if ((uVar25 & 1) == 0) {
                          local_2d0 = 0;
                          uVar25 = CONCAT71(uVar22,1);
                          cVar23 = GENERAL_LibraryType;
                          goto LAB_0035c2eb;
                        }
                        cVar23 = GENERAL_LibraryType;
                        LinkLibraryTypeSpecifierWarning(this,llt,0);
                      }
                    }
                    local_2d0 = 0;
                    uVar25 = CONCAT71(uVar22,1);
                  }
                }
              }
            }
          }
        }
      }
LAB_0035c2eb:
      llt = cVar23;
      local_2c0 = (ulong)((int)local_2c0 + 1);
      pbVar20 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar16 = (long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar20 >> 5;
      bVar5 = local_2c0 < uVar16;
    } while (local_2c0 < uVar16);
    bVar26 = false;
  }
LAB_0035c62f:
  if (!bVar5) {
    if (local_288 == '\x01') {
      if ((uVar25 & 1) != 0) {
LAB_0035c85c:
        __assert_fail("!haveLLT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmTargetLinkLibrariesCommand.cxx"
                      ,0xc1,
                      "auto cmTargetLinkLibrariesCommand(const std::vector<std::string> &, cmExecutionStatus &)::(anonymous class)::operator()() const"
                     );
      }
      bVar5 = anon_unknown.dwarf_11e8913::TLL::HandleLibrary
                        ((TLL *)local_268,currentProcessingState,&local_2a8,GENERAL_LibraryType);
      if (!bVar5) {
        bVar26 = false;
        goto LAB_0035c824;
      }
      if ((local_288 == '\x01') &&
         (local_288 = '\0',
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_2a8._M_dataplus._M_p != &local_2a8.field_2)) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
    }
    if ((uVar25 & 1) != 0) {
      local_1a8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x5;
      local_1a8._8_8_ = "The \"";
      pcVar21 = *(char **)((anonymous_namespace)::LinkLibraryTypeNames + (ulong)llt * 8);
      local_1f8._0_8_ = strlen(pcVar21);
      local_1f8._8_8_ = pcVar21;
      cmStrCat<char[42]>(&local_1c8,(cmAlphaNum *)local_1a8,(cmAlphaNum *)local_1f8,
                         (char (*) [42])"\" argument must be followed by a library.");
      cmMakefile::IssueMessage(local_270,FATAL_ERROR,&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      cmSystemTools::s_FatalErrorOccurred = true;
    }
    PVar9 = cmTarget::GetPolicyStatus(local_2b8,CMP0022);
    if (currentProcessingState == ProcessingLinkLibraries || WARN < PVar9) {
      bVar5 = false;
    }
    else {
      local_1a8._0_8_ = &local_198;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"LINK_INTERFACE_LIBRARIES","");
      cVar17 = cmTarget::GetProperty(local_2b8,(string *)local_1a8);
      bVar5 = cVar17.Value == (string *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._0_8_ != &local_198) {
        operator_delete((void *)local_1a8._0_8_,(ulong)(local_198._M_allocated_capacity + 1));
      }
    }
    bVar26 = true;
    if (bVar5) {
      local_1f8._0_8_ = local_1f8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1f8,"LINK_INTERFACE_LIBRARIES","");
      cmTarget::SetProperty(local_2b8,(string *)local_1f8,"");
      if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
        operator_delete((void *)local_1f8._0_8_,CONCAT71(local_1f8._17_7_,local_1f8[0x10]) + 1);
      }
    }
  }
LAB_0035c824:
  if ((local_288 == '\x01') &&
     (local_288 = '\0',
     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)local_2a8._M_dataplus._M_p != &local_2a8.field_2)) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  anon_unknown.dwarf_11e8913::TLL::~TLL((TLL *)local_268);
  return bVar26;
}

Assistant:

bool cmTargetLinkLibrariesCommand(std::vector<std::string> const& args,
                                  cmExecutionStatus& status)
{
  // Must have at least one argument.
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();

  // Alias targets cannot be on the LHS of this command.
  if (mf.IsAlias(args[0])) {
    status.SetError("can not be used on an ALIAS target.");
    return false;
  }

  // Lookup the target for which libraries are specified.
  cmTarget* target =
    mf.GetCMakeInstance()->GetGlobalGenerator()->FindTarget(args[0]);
  if (!target) {
    for (const auto& importedTarget : mf.GetOwnedImportedTargets()) {
      if (importedTarget->GetName() == args[0]) {
        target = importedTarget.get();
        break;
      }
    }
  }
  if (!target) {
    MessageType t = MessageType::FATAL_ERROR; // fail by default
    std::ostringstream e;
    e << "Cannot specify link libraries for target \"" << args[0] << "\" "
      << "which is not built by this project.";
    // The bad target is the only argument. Check how policy CMP0016 is set,
    // and accept, warn or fail respectively:
    if (args.size() < 2) {
      switch (mf.GetPolicyStatus(cmPolicies::CMP0016)) {
        case cmPolicies::WARN:
          t = MessageType::AUTHOR_WARNING;
          // Print the warning.
          e << "\n"
            << "CMake does not support this but it used to work accidentally "
            << "and is being allowed for compatibility."
            << "\n"
            << cmPolicies::GetPolicyWarning(cmPolicies::CMP0016);
          break;
        case cmPolicies::OLD: // OLD behavior does not warn.
          t = MessageType::MESSAGE;
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
          e << "\n" << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0016);
          break;
        case cmPolicies::NEW: // NEW behavior prints the error.
          break;
      }
    }
    // Now actually print the message.
    switch (t) {
      case MessageType::AUTHOR_WARNING:
        mf.IssueMessage(MessageType::AUTHOR_WARNING, e.str());
        break;
      case MessageType::FATAL_ERROR:
        mf.IssueMessage(MessageType::FATAL_ERROR, e.str());
        cmSystemTools::SetFatalErrorOccurred();
        break;
      default:
        break;
    }
    return true;
  }

  // Having a UTILITY library on the LHS is a bug.
  if (target->GetType() == cmStateEnums::UTILITY) {
    std::ostringstream e;
    const char* modal = nullptr;
    MessageType messageType = MessageType::AUTHOR_WARNING;
    switch (mf.GetPolicyStatus(cmPolicies::CMP0039)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0039) << "\n";
        modal = "should";
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        modal = "must";
        messageType = MessageType::FATAL_ERROR;
        break;
    }
    if (modal) {
      e << "Utility target \"" << target->GetName() << "\" " << modal
        << " not be used as the target of a target_link_libraries call.";
      mf.IssueMessage(messageType, e.str());
      if (messageType == MessageType::FATAL_ERROR) {
        return false;
      }
    }
  }

  // But we might not have any libs after variable expansion.
  if (args.size() < 2) {
    return true;
  }

  TLL tll(mf, target);

  // Keep track of link configuration specifiers.
  cmTargetLinkLibraryType llt = GENERAL_LibraryType;
  bool haveLLT = false;

  // Start with primary linking and switch to link interface
  // specification if the keyword is encountered as the first argument.
  ProcessingState currentProcessingState = ProcessingLinkLibraries;

  // Accumulate consectuive non-keyword arguments into one entry in
  // order to handle unquoted generator expressions containing ';'.
  std::size_t genexNesting = 0;
  cm::optional<std::string> currentEntry;
  auto processCurrentEntry = [&]() -> bool {
    // FIXME: Warn about partial genex if genexNesting > 0?
    genexNesting = 0;
    if (currentEntry) {
      assert(!haveLLT);
      if (!tll.HandleLibrary(currentProcessingState, *currentEntry,
                             GENERAL_LibraryType)) {
        return false;
      }
      currentEntry = cm::nullopt;
    }
    return true;
  };
  auto extendCurrentEntry = [&currentEntry](std::string const& arg) {
    if (currentEntry) {
      currentEntry = cmStrCat(*currentEntry, ';', arg);
    } else {
      currentEntry = arg;
    }
  };

  // Keep this list in sync with the keyword dispatch below.
  static std::unordered_set<std::string> const keywords{
    "LINK_INTERFACE_LIBRARIES",
    "INTERFACE",
    "LINK_PUBLIC",
    "PUBLIC",
    "LINK_PRIVATE",
    "PRIVATE",
    "debug",
    "optimized",
    "general",
  };

  // Add libraries, note that there is an optional prefix
  // of debug and optimized that can be used.
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (keywords.count(args[i])) {
      // A keyword argument terminates any accumulated partial genex.
      if (!processCurrentEntry()) {
        return false;
      }

      // Process this keyword argument.
      if (args[i] == "LINK_INTERFACE_LIBRARIES") {
        currentProcessingState = ProcessingPlainLinkInterface;
        if (i != 1) {
          mf.IssueMessage(
            MessageType::FATAL_ERROR,
            "The LINK_INTERFACE_LIBRARIES option must appear as the "
            "second argument, just after the target name.");
          return true;
        }
      } else if (args[i] == "INTERFACE") {
        if (i != 1 &&
            currentProcessingState != ProcessingKeywordPrivateInterface &&
            currentProcessingState != ProcessingKeywordPublicInterface &&
            currentProcessingState != ProcessingKeywordLinkInterface) {
          mf.IssueMessage(MessageType::FATAL_ERROR,
                          "The INTERFACE, PUBLIC or PRIVATE option must "
                          "appear as the second argument, just after the "
                          "target name.");
          return true;
        }
        currentProcessingState = ProcessingKeywordLinkInterface;
      } else if (args[i] == "LINK_PUBLIC") {
        if (i != 1 &&
            currentProcessingState != ProcessingPlainPrivateInterface &&
            currentProcessingState != ProcessingPlainPublicInterface) {
          mf.IssueMessage(
            MessageType::FATAL_ERROR,
            "The LINK_PUBLIC or LINK_PRIVATE option must appear as the "
            "second argument, just after the target name.");
          return true;
        }
        currentProcessingState = ProcessingPlainPublicInterface;
      } else if (args[i] == "PUBLIC") {
        if (i != 1 &&
            currentProcessingState != ProcessingKeywordPrivateInterface &&
            currentProcessingState != ProcessingKeywordPublicInterface &&
            currentProcessingState != ProcessingKeywordLinkInterface) {
          mf.IssueMessage(MessageType::FATAL_ERROR,
                          "The INTERFACE, PUBLIC or PRIVATE option must "
                          "appear as the second argument, just after the "
                          "target name.");
          return true;
        }
        currentProcessingState = ProcessingKeywordPublicInterface;
      } else if (args[i] == "LINK_PRIVATE") {
        if (i != 1 &&
            currentProcessingState != ProcessingPlainPublicInterface &&
            currentProcessingState != ProcessingPlainPrivateInterface) {
          mf.IssueMessage(
            MessageType::FATAL_ERROR,
            "The LINK_PUBLIC or LINK_PRIVATE option must appear as the "
            "second argument, just after the target name.");
          return true;
        }
        currentProcessingState = ProcessingPlainPrivateInterface;
      } else if (args[i] == "PRIVATE") {
        if (i != 1 &&
            currentProcessingState != ProcessingKeywordPrivateInterface &&
            currentProcessingState != ProcessingKeywordPublicInterface &&
            currentProcessingState != ProcessingKeywordLinkInterface) {
          mf.IssueMessage(MessageType::FATAL_ERROR,
                          "The INTERFACE, PUBLIC or PRIVATE option must "
                          "appear as the second argument, just after the "
                          "target name.");
          return true;
        }
        currentProcessingState = ProcessingKeywordPrivateInterface;
      } else if (args[i] == "debug") {
        if (haveLLT) {
          LinkLibraryTypeSpecifierWarning(mf, llt, DEBUG_LibraryType);
        }
        llt = DEBUG_LibraryType;
        haveLLT = true;
      } else if (args[i] == "optimized") {
        if (haveLLT) {
          LinkLibraryTypeSpecifierWarning(mf, llt, OPTIMIZED_LibraryType);
        }
        llt = OPTIMIZED_LibraryType;
        haveLLT = true;
      } else if (args[i] == "general") {
        if (haveLLT) {
          LinkLibraryTypeSpecifierWarning(mf, llt, GENERAL_LibraryType);
        }
        llt = GENERAL_LibraryType;
        haveLLT = true;
      }
    } else if (haveLLT) {
      // The link type was specified by the previous argument.
      haveLLT = false;
      assert(!currentEntry);
      if (!tll.HandleLibrary(currentProcessingState, args[i], llt)) {
        return false;
      }
      llt = GENERAL_LibraryType;
    } else {
      // Track the genex nesting level.
      {
        cm::string_view arg = args[i];
        for (std::string::size_type pos = 0; pos < arg.size(); ++pos) {
          cm::string_view cur = arg.substr(pos);
          if (cmHasLiteralPrefix(cur, "$<")) {
            ++genexNesting;
            ++pos;
          } else if (genexNesting > 0 && cmHasLiteralPrefix(cur, ">")) {
            --genexNesting;
          }
        }
      }

      // Accumulate this argument in the current entry.
      extendCurrentEntry(args[i]);

      // Process this entry if it does not end inside a genex.
      if (genexNesting == 0) {
        if (!processCurrentEntry()) {
          return false;
        }
      }
    }
  }

  // Process the last accumulated partial genex, if any.
  if (!processCurrentEntry()) {
    return false;
  }

  // Make sure the last argument was not a library type specifier.
  if (haveLLT) {
    mf.IssueMessage(MessageType::FATAL_ERROR,
                    cmStrCat("The \"", LinkLibraryTypeNames[llt],
                             "\" argument must be followed by a library."));
    cmSystemTools::SetFatalErrorOccurred();
  }

  const cmPolicies::PolicyStatus policy22Status =
    target->GetPolicyStatusCMP0022();

  // If any of the LINK_ options were given, make sure the
  // LINK_INTERFACE_LIBRARIES target property exists.
  // Use of any of the new keywords implies awareness of
  // this property. And if no libraries are named, it should
  // result in an empty link interface.
  if ((policy22Status == cmPolicies::OLD ||
       policy22Status == cmPolicies::WARN) &&
      currentProcessingState != ProcessingLinkLibraries &&
      !target->GetProperty("LINK_INTERFACE_LIBRARIES")) {
    target->SetProperty("LINK_INTERFACE_LIBRARIES", "");
  }

  return true;
}